

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_bool32 ma_is_spatial_channel_position(ma_channel channelPosition)

{
  int local_14;
  wchar_t i;
  ma_channel channelPosition_local;
  
  if ((((channelPosition != '\0') && (channelPosition != '\x01')) && (channelPosition != '\x05')) &&
     ((channelPosition < 0x14 || (0x33 < channelPosition)))) {
    for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
      if ((g_maChannelPlaneRatios[channelPosition][local_14] != 0.0) ||
         (NAN(g_maChannelPlaneRatios[channelPosition][local_14]))) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static ma_bool32 ma_is_spatial_channel_position(ma_channel channelPosition)
{
    int i;

    if (channelPosition == MA_CHANNEL_NONE || channelPosition == MA_CHANNEL_MONO || channelPosition == MA_CHANNEL_LFE) {
        return MA_FALSE;
    }

    if (channelPosition >= MA_CHANNEL_AUX_0 && channelPosition <= MA_CHANNEL_AUX_31) {
        return MA_FALSE;
    }

    for (i = 0; i < 6; ++i) {   /* Each side of a cube. */
        if (g_maChannelPlaneRatios[channelPosition][i] != 0) {
            return MA_TRUE;
        }
    }

    return MA_FALSE;
}